

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TParseContext::handleLengthMethod
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *intermNode)

{
  TIntermediate *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TType *type;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__lhs;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long *plVar3;
  long lVar4;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermTyped *pTVar5;
  TIntermConstantUnion *pTVar6;
  undefined4 extraout_var_10;
  char *pcVar7;
  char *pcVar8;
  TParseContext *this_01;
  char *pcVar9;
  _func_int **pp_Var10;
  TType local_c8;
  undefined4 extraout_var_06;
  
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (iVar2 < 1) {
    iVar2 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
    type = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0xf0))
                              ((long *)CONCAT44(extraout_var_00,iVar2));
    iVar2 = (*type->_vptr_TType[0x1d])(type);
    if ((char)iVar2 == '\0') {
      iVar2 = (*type->_vptr_TType[0x1c])(type);
      if ((char)iVar2 != '\0') {
        iVar2 = (*type->_vptr_TType[0xd])(type);
        goto LAB_004106db;
      }
      iVar2 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar2 != '\0') {
        iVar2 = (*type->_vptr_TType[0xc])(type);
        goto LAB_004106db;
      }
      if ((*(ushort *)&type->field_0xa & 0x860) != 0) goto LAB_00410687;
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = ".length()";
      pcVar7 = "unexpected use of .length()";
      goto LAB_00410443;
    }
    iVar2 = (*type->_vptr_TType[0x1f])();
    if ((char)iVar2 == '\0') {
      iVar2 = (*type->_vptr_TType[0x10])(type);
      if (CONCAT44(extraout_var_04,iVar2) != 0) {
        iVar2 = (*type->_vptr_TType[0x10])();
        return (TIntermTyped *)CONCAT44(extraout_var_05,iVar2);
      }
      iVar2 = (*type->_vptr_TType[0xf])(type);
      goto LAB_004106db;
    }
    iVar2 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
    if ((CONCAT44(extraout_var_01,iVar2) == 0) || (bVar1 = isIoResizeArray(this,type), !bVar1)) {
      iVar2 = (*intermNode->_vptr_TIntermNode[3])(intermNode);
      plVar3 = (long *)CONCAT44(extraout_var_06,iVar2);
      if ((plVar3 != (long *)0x0) &&
         (lVar4 = (**(code **)(*plVar3 + 0x108))(plVar3), (*(uint *)(lVar4 + 8) & 0xff80) == 0x2380)
         ) {
        TParseVersions::requireProfile
                  ((TParseVersions *)this,loc,8,
                   "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
        iVar2 = ((this->resources).maxSamples + 0x1f) / 0x20;
        goto LAB_00410606;
      }
    }
    else {
      iVar2 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
      __lhs = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 400))
                        ((long *)CONCAT44(extraout_var_02,iVar2));
      bVar1 = std::operator==(__lhs,"gl_in");
      if ((((bVar1) || (bVar1 = std::operator==(__lhs,"gl_out"), bVar1)) ||
          (bVar1 = std::operator==(__lhs,"gl_MeshVerticesNV"), bVar1)) ||
         (bVar1 = std::operator==(__lhs,"gl_MeshPrimitivesNV"), bVar1)) {
        iVar2 = (*type->_vptr_TType[0xb])(type);
        iVar2 = getIoArrayImplicitSize
                          (this,(TQualifier *)CONCAT44(extraout_var_03,iVar2),(TString *)0x0);
LAB_00410606:
        if (iVar2 != 0) goto LAB_004106db;
      }
    }
    iVar2 = (*intermNode->_vptr_TIntermNode[0xc])(intermNode);
    if ((CONCAT44(extraout_var_07,iVar2) == 0) || (bVar1 = isIoResizeArray(this,type), !bVar1)) {
      this_01 = (TParseContext *)intermNode;
      iVar2 = (*intermNode->_vptr_TIntermNode[3])();
      bVar1 = isRuntimeLength(this_01,(TIntermTyped *)CONCAT44(extraout_var_09,iVar2));
      if (bVar1) {
LAB_00410687:
        this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TType::TType(&local_c8,EbtInt,EvqTemporary,1,0,0,false);
        pTVar5 = TIntermediate::addBuiltInFunctionCall
                           (this_00,loc,EOpArrayLength,true,intermNode,&local_c8);
        return pTVar5;
      }
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      pcVar7 = *(char **)(CONCAT44(extraout_var_10,iVar2) + 8);
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "";
      pcVar9 = "array must be declared with a size before using this method";
    }
    else {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      pcVar7 = *(char **)(CONCAT44(extraout_var_08,iVar2) + 8);
      pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar8 = "";
      pcVar9 = "array must first be sized by a redeclaration or layout qualifier";
    }
  }
  else {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    pcVar7 = *(char **)(CONCAT44(extraout_var,iVar2) + 8);
    pp_Var10 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar8 = "method does not accept any arguments";
LAB_00410443:
    pcVar9 = "";
  }
  iVar2 = 0;
  (*pp_Var10[0x2d])(this,loc,pcVar8,pcVar7,pcVar9);
LAB_004106db:
  pTVar6 = TIntermediate::addConstantUnion
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      iVar2 + (uint)(iVar2 == 0),loc,false);
  return &pTVar6->super_TIntermTyped;
}

Assistant:

TIntermTyped* TParseContext::handleLengthMethod(const TSourceLoc& loc, TFunction* function, TIntermNode* intermNode)
{
    int length = 0;

    if (function->getParamCount() > 0)
        error(loc, "method does not accept any arguments", function->getName().c_str(), "");
    else {
        const TType& type = intermNode->getAsTyped()->getType();
        if (type.isArray()) {
            if (type.isUnsizedArray()) {
                if (intermNode->getAsSymbolNode() && isIoResizeArray(type)) {
                    // We could be between a layout declaration that gives a built-in io array implicit size and
                    // a user redeclaration of that array, meaning we have to substitute its implicit size here
                    // without actually redeclaring the array.  (It is an error to use a member before the
                    // redeclaration, but not an error to use the array name itself.)
                    const TString& name = intermNode->getAsSymbolNode()->getName();
                    if (name == "gl_in" || name == "gl_out" || name == "gl_MeshVerticesNV" ||
                        name == "gl_MeshPrimitivesNV") {
                        length = getIoArrayImplicitSize(type.getQualifier());
                    }
                } else if (const auto typed = intermNode->getAsTyped()) {
                    if (typed->getQualifier().builtIn == EbvSampleMask) {
                        requireProfile(loc, EEsProfile, "the array size of gl_SampleMask and gl_SampleMaskIn is ceil(gl_MaxSamples/32)");
                        length = (resources.maxSamples + 31) / 32;
                    }
                }
                if (length == 0) {
                    if (intermNode->getAsSymbolNode() && isIoResizeArray(type))
                        error(loc, "", function->getName().c_str(), "array must first be sized by a redeclaration or layout qualifier");
                    else if (isRuntimeLength(*intermNode->getAsTyped())) {
                        // Create a unary op and let the back end handle it
                        return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
                    } else
                        error(loc, "", function->getName().c_str(), "array must be declared with a size before using this method");
                }
            } else if (type.getOuterArrayNode()) {
                // If the array's outer size is specified by an intermediate node, it means the array's length
                // was specified by a specialization constant. In such a case, we should return the node of the
                // specialization constants to represent the length.
                return type.getOuterArrayNode();
            } else
                length = type.getOuterArraySize();
        } else if (type.isMatrix())
            length = type.getMatrixCols();
        else if (type.isVector())
            length = type.getVectorSize();
        else if (type.isCoopMat() || type.isCoopVecNV())
            return intermediate.addBuiltInFunctionCall(loc, EOpArrayLength, true, intermNode, TType(EbtInt));
        else {
            // we should not get here, because earlier semantic checking should have prevented this path
            error(loc, ".length()", "unexpected use of .length()", "");
        }
    }

    if (length == 0)
        length = 1;

    return intermediate.addConstantUnion(length, loc);
}